

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall duckdb_re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  const_pointer pcVar1;
  const_pointer pcVar2;
  State *pSVar3;
  uint8_t c;
  bool bVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint32_t flags;
  StartInfo *info;
  ostringstream local_198 [376];
  
  pcVar1 = (params->text).data_;
  pcVar2 = (params->context).data_;
  if (pcVar1 < pcVar2) {
LAB_01b2388f:
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"context does not contain text");
    std::__cxx11::ostringstream::~ostringstream(local_198);
    params->start = (State *)0x1;
    return true;
  }
  puVar6 = (uint8_t *)(pcVar1 + (params->text).size_);
  if (pcVar2 + (params->context).size_ < puVar6) goto LAB_01b2388f;
  if (params->run_forward == true) {
    if (pcVar1 != pcVar2) {
      c = pcVar1[-1];
LAB_01b238ea:
      if (c == '\n') {
        flags = 1;
        uVar5 = 2;
      }
      else {
        bVar4 = Prog::IsWordChar(c);
        uVar5 = (uint)!bVar4 * 2 + 4;
        flags = (uint)bVar4 << 9;
      }
      goto LAB_01b23918;
    }
  }
  else if (puVar6 != (uint8_t *)(pcVar2 + (params->context).size_)) {
    c = *puVar6;
    goto LAB_01b238ea;
  }
  flags = 5;
  uVar5 = 0;
LAB_01b23918:
  info = this->start_ + (uVar5 | params->anchored);
  bVar4 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar4) {
    ResetCache(this,params->cache_lock);
    bVar4 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar4) {
      params->failed = true;
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,"Failed to analyze start state.");
      std::__cxx11::ostringstream::~ostringstream(local_198);
      return false;
    }
  }
  pSVar3 = (info->start)._M_b._M_p;
  params->start = pSVar3;
  if (this->prog_->prefix_size_ == 0) {
    return true;
  }
  if (params->anchored != false) {
    return true;
  }
  if (pSVar3 < (State *)0x3) {
    return true;
  }
  if (0xffff < pSVar3->flag_) {
    return true;
  }
  params->can_prefix_accel = true;
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (BeginPtr(text) < BeginPtr(context) || EndPtr(text) > EndPtr(context)) {
    LOG(DFATAL) << "context does not contain text";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint32_t flags;
  if (params->run_forward) {
    if (BeginPtr(text) == BeginPtr(context)) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (BeginPtr(text)[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(BeginPtr(text)[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (EndPtr(text) == EndPtr(context)) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (EndPtr(text)[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(EndPtr(text)[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored)
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      params->failed = true;
      LOG(DFATAL) << "Failed to analyze start state.";
      return false;
    }
  }

  params->start = info->start.load(std::memory_order_acquire);

  // Even if we could prefix accel, we cannot do so when anchored and,
  // less obviously, we cannot do so when we are going to need flags.
  // This trick works only when there is a single byte that leads to a
  // different state!
  if (prog_->can_prefix_accel() &&
      !params->anchored &&
      params->start > SpecialStateMax &&
      params->start->flag_ >> kFlagNeedShift == 0)
    params->can_prefix_accel = true;

  return true;
}